

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_hasReturnValue_Test::testBody
          (TEST_MockReturnValueTest_hasReturnValue_Test *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  UtestShell *pUVar4;
  MockSupport *pMVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockReturnValueTest_hasReturnValue_Test *local_10;
  TEST_MockReturnValueTest_hasReturnValue_Test *this_local;
  
  local_10 = this;
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_20,"");
  pMVar5 = mock(&local_20,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar5->_vptr_MockSupport[7])();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)((byte)((byte)iVar2 ^ 1) & 1),"CHECK","!mock().hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2a,pTVar6);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"");
  pMVar5 = mock(local_40,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"foo");
  (*pMVar5->_vptr_MockSupport[3])(pMVar5,&local_50);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(local_40);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"");
  pMVar5 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*pMVar5->_vptr_MockSupport[6])(pMVar5,&local_70);
  bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xa0))();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)((bVar1 ^ 1) & 1),"CHECK","!mock().actualCall(\"foo\").hasReturnValue()",
             0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2c,pTVar6);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_80,"");
  pMVar5 = mock(&local_80,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar5->_vptr_MockSupport[7])();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)((byte)((byte)iVar2 ^ 1) & 1),"CHECK","!mock().hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2d,pTVar6);
  SimpleString::~SimpleString(&local_80);
  SimpleString::SimpleString(&local_90,"");
  pMVar5 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo2");
  iVar2 = (*pMVar5->_vptr_MockSupport[3])(pMVar5,&local_a0);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 200))
            ((long *)CONCAT44(extraout_var_00,iVar2),1);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_b0,"");
  pMVar5 = mock(&local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c0,"foo2");
  iVar2 = (*pMVar5->_vptr_MockSupport[6])(pMVar5,&local_c0);
  bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xa0))();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(bVar1 & 1),"CHECK","mock().actualCall(\"foo2\").hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x30,pTVar6);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_d0,"");
  pMVar5 = mock(&local_d0,(MockFailureReporter *)0x0);
  uVar3 = (*pMVar5->_vptr_MockSupport[7])();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar3 & 1),"CHECK","mock().hasReturnValue()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x31,pTVar6);
  SimpleString::~SimpleString(&local_d0);
  return;
}

Assistant:

TEST(MockReturnValueTest, hasReturnValue)
{
    CHECK(!mock().hasReturnValue());
    mock().expectOneCall("foo");
    CHECK(!mock().actualCall("foo").hasReturnValue());
    CHECK(!mock().hasReturnValue());

    mock().expectOneCall("foo2").andReturnValue(1);
    CHECK(mock().actualCall("foo2").hasReturnValue());
    CHECK(mock().hasReturnValue());
}